

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O2

void outblank_stream(out_stream_info *stream)

{
  outflushn_stream(stream,1);
  if ((stream->html_mode != 0) && (stream->html_target != 0)) {
    outstring_stream(stream,"<BR>");
  }
  t_outline(stream,1,"\n",(int *)0x0);
  return;
}

Assistant:

static void outblank_stream(out_stream_info *stream)
{
    /* flush the stream */
    outflushn_stream(stream, 1);

    /* if generating for an HTML display target, add an HTML line break */
    if (stream->html_mode && stream->html_target)
        outstring_stream(stream, "<BR>");

    /* write out the newline */
    t_outline(stream, 1, "\n", 0);
}